

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.c
# Opt level: O0

HT_DurationNs ht_task_scheduler_get_optimal_tick_period(HT_TaskScheduler *task_scheduler)

{
  HT_DurationNs local_30;
  HT_DurationNs task_period;
  HT_DurationNs perfect_period;
  size_t task_pos;
  HT_TaskScheduler *task_scheduler_local;
  
  task_period = 0;
  for (perfect_period = 0; perfect_period < (task_scheduler->tasks).size;
      perfect_period = perfect_period + 1) {
    local_30 = *(HT_DurationNs *)((long)(task_scheduler->tasks).data[perfect_period] + 0x10);
    if (local_30 != 0) {
      if (task_period != 0) {
        local_30 = _greatest_common_divisor(task_period,local_30);
      }
      task_period = local_30;
    }
  }
  return task_period;
}

Assistant:

HT_DurationNs
ht_task_scheduler_get_optimal_tick_period(HT_TaskScheduler* task_scheduler)
{
    size_t task_pos;
    HT_DurationNs perfect_period = 0;

    for (task_pos = 0; task_pos < task_scheduler->tasks.size; task_pos++)
    {
        HT_DurationNs task_period = HT_TASK(task_scheduler->tasks.data[task_pos])->period;

        if (task_period == 0)
        {
            continue;
        }

        perfect_period = perfect_period == 0 ? task_period : _greatest_common_divisor(perfect_period, task_period);
    }

    return perfect_period;
}